

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileTargetGenerator::AddIncludeFlags
          (cmMakefileTargetGenerator *this,string *flags,string *lang)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *this_00;
  pointer pcVar3;
  _Alloc_hider name_00;
  bool forResponseFile;
  string *psVar4;
  long *plVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *makefile_depends;
  undefined8 *puVar6;
  size_type *psVar7;
  undefined8 uVar8;
  string responseFlag;
  string includeFlags;
  string arg;
  string name;
  string responseFlagVar;
  string local_88;
  string responseVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  
  responseVar._M_dataplus._M_p = (pointer)&responseVar.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&responseVar,"CMAKE_","");
  std::__cxx11::string::_M_append((char *)&responseVar,(ulong)(lang->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)&responseVar);
  forResponseFile = cmMakefile::IsOn((this->super_cmCommonTargetGenerator).Makefile,&responseVar);
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  paVar1 = &includeFlags.field_2;
  includeFlags._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&includeFlags,"CMAKE_BUILD_TYPE","");
  psVar4 = cmMakefile::GetSafeDefinition(this_00,&includeFlags);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includeFlags._M_dataplus._M_p != paVar1) {
    operator_delete(includeFlags._M_dataplus._M_p,includeFlags.field_2._M_allocated_capacity + 1);
  }
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)this->LocalGenerator,&includes,
             (this->super_cmCommonTargetGenerator).GeneratorTarget,lang,psVar4);
  cmLocalGenerator::GetIncludeFlags
            (&includeFlags,(cmLocalGenerator *)this->LocalGenerator,&includes,
             (this->super_cmCommonTargetGenerator).GeneratorTarget,lang,false,forResponseFile,psVar4
            );
  if (includeFlags._M_string_length == 0) goto LAB_003f0cf9;
  if (!forResponseFile) {
    (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
      _vptr_cmLocalGenerator[6])(this->LocalGenerator,flags,&includeFlags);
    goto LAB_003f0cf9;
  }
  std::operator+(&responseFlag,"CMAKE_",lang);
  plVar5 = (long *)std::__cxx11::string::append((char *)&responseFlag);
  responseFlagVar._M_dataplus._M_p = (pointer)&responseFlagVar.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar7) {
    responseFlagVar.field_2._M_allocated_capacity = *psVar7;
    responseFlagVar.field_2._8_8_ = plVar5[3];
  }
  else {
    responseFlagVar.field_2._M_allocated_capacity = *psVar7;
    responseFlagVar._M_dataplus._M_p = (pointer)*plVar5;
  }
  responseFlagVar._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  paVar2 = &responseFlag.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)responseFlag._M_dataplus._M_p != paVar2) {
    operator_delete(responseFlag._M_dataplus._M_p,responseFlag.field_2._M_allocated_capacity + 1);
  }
  psVar4 = cmMakefile::GetSafeDefinition
                     ((this->super_cmCommonTargetGenerator).Makefile,&responseFlagVar);
  pcVar3 = (psVar4->_M_dataplus)._M_p;
  responseFlag._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&responseFlag,pcVar3,pcVar3 + psVar4->_M_string_length);
  if (responseFlag._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&responseFlag,0,(char *)0x0,0x605b0b);
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&name,"includes_","");
  std::__cxx11::string::_M_append((char *)&name,(ulong)(lang->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)&name);
  name_00 = name._M_dataplus;
  makefile_depends =
       &std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefileTargetGenerator::StringList,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefileTargetGenerator::StringList>_>_>
        ::operator[](&this->FlagFileDepends,lang)->
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  CreateResponseFile(&local_88,this,name_00._M_p,&includeFlags,makefile_depends);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)responseFlag._M_dataplus._M_p != paVar2) {
    uVar8 = responseFlag.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_88._M_string_length + responseFlag._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      uVar8 = local_88.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_88._M_string_length + responseFlag._M_string_length) goto LAB_003f0be7;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_88,0,(char *)0x0,(ulong)responseFlag._M_dataplus._M_p);
  }
  else {
LAB_003f0be7:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&responseFlag,(ulong)local_88._M_dataplus._M_p)
    ;
  }
  arg._M_dataplus._M_p = (pointer)&arg.field_2;
  psVar7 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar7) {
    arg.field_2._M_allocated_capacity = *psVar7;
    arg.field_2._8_8_ = puVar6[3];
  }
  else {
    arg.field_2._M_allocated_capacity = *psVar7;
    arg._M_dataplus._M_p = (pointer)*puVar6;
  }
  arg._M_string_length = puVar6[1];
  *puVar6 = psVar7;
  puVar6[1] = 0;
  *(char *)psVar7 = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[6])(this->LocalGenerator,flags,&arg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg._M_dataplus._M_p != &arg.field_2) {
    operator_delete(arg._M_dataplus._M_p,arg.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)responseFlag._M_dataplus._M_p != paVar2) {
    operator_delete(responseFlag._M_dataplus._M_p,responseFlag.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)responseFlagVar._M_dataplus._M_p != &responseFlagVar.field_2) {
    operator_delete(responseFlagVar._M_dataplus._M_p,
                    responseFlagVar.field_2._M_allocated_capacity + 1);
  }
LAB_003f0cf9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includeFlags._M_dataplus._M_p != paVar1) {
    operator_delete(includeFlags._M_dataplus._M_p,includeFlags.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&includes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)responseVar._M_dataplus._M_p != &responseVar.field_2) {
    operator_delete(responseVar._M_dataplus._M_p,responseVar.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::AddIncludeFlags(std::string& flags,
                                                const std::string& lang)
{
  std::string responseVar = "CMAKE_";
  responseVar += lang;
  responseVar += "_USE_RESPONSE_FILE_FOR_INCLUDES";
  bool useResponseFile = this->Makefile->IsOn(responseVar);

  std::vector<std::string> includes;
  const std::string& config =
    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              lang, config);

  std::string includeFlags = this->LocalGenerator->GetIncludeFlags(
    includes, this->GeneratorTarget, lang, false, useResponseFile, config);
  if (includeFlags.empty()) {
    return;
  }

  if (useResponseFile) {
    std::string const responseFlagVar =
      "CMAKE_" + lang + "_RESPONSE_FILE_FLAG";
    std::string responseFlag =
      this->Makefile->GetSafeDefinition(responseFlagVar);
    if (responseFlag.empty()) {
      responseFlag = "@";
    }
    std::string name = "includes_";
    name += lang;
    name += ".rsp";
    std::string arg = std::move(responseFlag) +
      this->CreateResponseFile(name.c_str(), includeFlags,
                               this->FlagFileDepends[lang]);
    this->LocalGenerator->AppendFlags(flags, arg);
  } else {
    this->LocalGenerator->AppendFlags(flags, includeFlags);
  }
}